

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool QApplicationPrivate::tryModalHelper(QWidget *widget,QWidget **rettop)

{
  bool bVar1;
  QWidget *pQVar2;
  
  pQVar2 = QApplication::activeModalWidget();
  if (rettop != (QWidget **)0x0) {
    *rettop = pQVar2;
  }
  pQVar2 = QApplication::activePopupWidget();
  bVar1 = true;
  if (pQVar2 == (QWidget *)0x0) {
    pQVar2 = QWidget::window(widget);
    bVar1 = isBlockedByModal(pQVar2);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool QApplicationPrivate::tryModalHelper(QWidget *widget, QWidget **rettop)
{
    QWidget *top = QApplication::activeModalWidget();
    if (rettop)
        *rettop = top;

    // the active popup widget always gets the input event
    if (QApplication::activePopupWidget())
        return true;

    return !isBlockedByModal(widget->window());
}